

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationarrow.cpp
# Opt level: O3

void __thiscall QtMWidgets::NavigationArrow::animate(NavigationArrow *this)

{
  NavigationArrowPrivate *pNVar1;
  char cVar2;
  QColor QVar3;
  
  cVar2 = QTimer::isActive();
  if (cVar2 != '\0') {
    QTimer::stop();
  }
  QVar3 = lighterColor(&((this->d).d)->baseColor,0x19);
  pNVar1 = (this->d).d;
  *(long *)&pNVar1->color = QVar3._0_8_;
  *(int *)((long)&(pNVar1->color).ct + 4) = QVar3.ct._4_4_;
  (pNVar1->color).ct.argb.pad = QVar3.ct._8_2_;
  QTimer::start((int)((this->d).d)->timer);
  QWidget::update();
  return;
}

Assistant:

void
NavigationArrow::animate()
{
	if( d->timer->isActive() )
		d->timer->stop();

	d->color = lighterColor( d->baseColor, 25 );

	d->timer->start( 500 );

	update();
}